

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void anon_unknown.dwarf_13f21e::fill2(unsigned_short *data,int n,int m,Rand48 *rand48)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    data[uVar1] = 0;
  }
  iVar4 = 0;
  if (0 < m) {
    iVar4 = m;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    dVar6 = (double)Imath_3_2::erand48(rand48->_state);
    lVar2 = Imath_3_2::nrand48(rand48->_state);
    data[lVar2 % (long)(ulong)(uint)n] = (unsigned_short)(int)(dVar6 * 65536.0);
  }
  return;
}

Assistant:

void
fill2 (
    unsigned short data[/*n*/], int n, int m, IMATH_NAMESPACE::Rand48& rand48)
{
    for (int i = 0; i < n; ++i)
        data[i] = 0;

    for (int i = 0; i < m; ++i)
        data[rand48.nexti () % n] =
            (unsigned short) (rand48.nextf () * (USHRT_MAX + 1));
}